

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

int resolve_unres_schema_types
              (unres_schema *unres,UNRES_ITEM types,ly_ctx *ctx,int forward_ref,int print_all_errors
              ,uint32_t *resolved)

{
  LY_ERR *pLVar1;
  bool local_61;
  LY_ERR local_60;
  int_log_opts local_5c;
  LY_ERR prev_ly_errno;
  int_log_opts prev_ilo;
  ly_err_item *prev_eitem;
  int local_48;
  int rc;
  int ret;
  uint32_t res_count;
  uint32_t unres_count;
  uint32_t i;
  uint32_t *resolved_local;
  int print_all_errors_local;
  int forward_ref_local;
  ly_ctx *ctx_local;
  unres_schema *puStack_18;
  UNRES_ITEM types_local;
  unres_schema *unres_local;
  
  local_48 = 0;
  _unres_count = resolved;
  resolved_local._0_4_ = print_all_errors;
  resolved_local._4_4_ = forward_ref;
  _print_all_errors_local = ctx;
  ctx_local._4_4_ = types;
  puStack_18 = unres;
  if (forward_ref != 0) {
    pLVar1 = ly_errno_glob_address();
    local_60 = *pLVar1;
    ly_ilo_change(_print_all_errors_local,ILO_STORE,&local_5c,(ly_err_item **)&prev_ly_errno);
  }
  do {
    ret = 0;
    rc = 0;
    for (res_count = 0; res_count < puStack_18->count; res_count = res_count + 1) {
      if ((puStack_18->type[res_count] & ctx_local._4_4_) != 0) {
        ret = ret + 1;
        prev_eitem._4_4_ =
             resolve_unres_schema_item
                       (puStack_18->module[res_count],puStack_18->item[res_count],
                        puStack_18->type[res_count],puStack_18->str_snode[res_count],puStack_18);
        if (puStack_18->type[res_count] == UNRES_EXT_FINALIZE) {
          puStack_18->type[res_count] = UNRES_RESOLVED;
        }
        if ((prev_eitem._4_4_ == 0) || (puStack_18->type[res_count] == UNRES_XPATH)) {
          if (puStack_18->type[res_count] == UNRES_LIST_UNIQ) {
            free(puStack_18->item[res_count]);
          }
          puStack_18->type[res_count] = UNRES_RESOLVED;
          *_unres_count = *_unres_count + 1;
          rc = rc + 1;
        }
        else if ((prev_eitem._4_4_ == 1) && (resolved_local._4_4_ != 0)) {
          ly_err_free_next(_print_all_errors_local,_prev_ly_errno);
        }
        else {
          if ((int)resolved_local == 0) {
            if (resolved_local._4_4_ != 0) {
              ly_ilo_restore(_print_all_errors_local,local_5c,_prev_ly_errno,1);
            }
            return -1;
          }
          rc = rc + 1;
          local_48 = -1;
        }
      }
    }
    local_61 = rc != 0 && (uint)rc < (uint)ret;
  } while (local_61);
  if ((uint)rc < (uint)ret) {
    if (resolved_local._4_4_ == 0) {
      __assert_fail("forward_ref",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                    ,0x1cdd,
                    "int resolve_unres_schema_types(struct unres_schema *, enum UNRES_ITEM, struct ly_ctx *, int, int, uint32_t *)"
                   );
    }
    ly_ilo_restore(_print_all_errors_local,local_5c,_prev_ly_errno,0);
    for (res_count = 0; res_count < puStack_18->count; res_count = res_count + 1) {
      if ((puStack_18->type[res_count] & ctx_local._4_4_) != 0) {
        resolve_unres_schema_item
                  (puStack_18->module[res_count],puStack_18->item[res_count],
                   puStack_18->type[res_count],puStack_18->str_snode[res_count],puStack_18);
      }
    }
    unres_local._4_4_ = -1;
  }
  else {
    if (resolved_local._4_4_ != 0) {
      ly_ilo_restore(_print_all_errors_local,local_5c,_prev_ly_errno,0);
      pLVar1 = ly_errno_glob_address();
      *pLVar1 = local_60;
    }
    unres_local._4_4_ = local_48;
  }
  return unres_local._4_4_;
}

Assistant:

static int
resolve_unres_schema_types(struct unres_schema *unres, enum UNRES_ITEM types, struct ly_ctx *ctx, int forward_ref,
                           int print_all_errors, uint32_t *resolved)
{
    uint32_t i, unres_count, res_count;
    int ret = 0, rc;
    struct ly_err_item *prev_eitem;
    enum int_log_opts prev_ilo;
    LY_ERR prev_ly_errno;

    /* if there can be no forward references, every failure is final, so we can print it directly */
    if (forward_ref) {
        prev_ly_errno = ly_errno;
        ly_ilo_change(ctx, ILO_STORE, &prev_ilo, &prev_eitem);
    }

    do {
        unres_count = 0;
        res_count = 0;

        for (i = 0; i < unres->count; ++i) {
            /* UNRES_TYPE_LEAFREF must be resolved (for storing leafref target pointers);
             * if-features are resolved here to make sure that we will have all if-features for
             * later check of feature circular dependency */
            if (unres->type[i] & types) {
                ++unres_count;
                rc = resolve_unres_schema_item(unres->module[i], unres->item[i], unres->type[i], unres->str_snode[i], unres);
                if (unres->type[i] == UNRES_EXT_FINALIZE) {
                    /* to avoid double free */
                    unres->type[i] = UNRES_RESOLVED;
                }
                if (!rc || (unres->type[i] == UNRES_XPATH)) {
                    /* invalid XPath can never cause an error, only a warning */
                    if (unres->type[i] == UNRES_LIST_UNIQ) {
                        /* free the allocated structure */
                        free(unres->item[i]);
                    }

                    unres->type[i] = UNRES_RESOLVED;
                    ++(*resolved);
                    ++res_count;
                } else if ((rc == EXIT_FAILURE) && forward_ref) {
                    /* forward reference, erase errors */
                    ly_err_free_next(ctx, prev_eitem);
                } else if (print_all_errors) {
                    /* just so that we quit the loop */
                    ++res_count;
                    ret = -1;
                } else {
                    if (forward_ref) {
                        ly_ilo_restore(ctx, prev_ilo, prev_eitem, 1);
                    }
                    return -1;
                }
            }
        }
    } while (res_count && (res_count < unres_count));

    if (res_count < unres_count) {
        assert(forward_ref);
        /* just print the errors (but we must free the ones we have and get them again :-/ ) */
        ly_ilo_restore(ctx, prev_ilo, prev_eitem, 0);

        for (i = 0; i < unres->count; ++i) {
            if (unres->type[i] & types) {
                resolve_unres_schema_item(unres->module[i], unres->item[i], unres->type[i], unres->str_snode[i], unres);
            }
        }
        return -1;
    }

    if (forward_ref) {
        /* restore log */
        ly_ilo_restore(ctx, prev_ilo, prev_eitem, 0);
        ly_errno = prev_ly_errno;
    }

    return ret;
}